

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
          (HashSetResizeHelper *this,CommonFields *c,allocator<char> *param_3,char param_4,
          undefined8 param_5,undefined8 param_6)

{
  void *pvVar1;
  bool bVar2;
  GenerationType GVar3;
  size_t sVar4;
  size_t sVar5;
  ctrl_t *pcVar6;
  allocator local_6b;
  byte local_6a;
  GenerationType local_69;
  bool grow_single_group;
  void *pvStack_68;
  GenerationType old_generation;
  char *mem;
  RawHashSetLayout layout;
  bool has_infoz;
  HashtablezInfoHandle infoz;
  size_t value_size_local;
  size_t key_size_local;
  ctrl_t soo_slot_h2_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  sVar4 = CommonFields::capacity(c);
  if (sVar4 == 0) {
    __assert_fail("c.capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7f5,
                  "bool absl::container_internal::HashSetResizeHelper::InitializeSlots(CommonFields &, Alloc, ctrl_t, size_t, size_t) [Alloc = std::allocator<char>, SizeOfSlot = 16UL, TransferUsesMemcpy = true, SooEnabled = true, AlignOfSlot = 8UL]"
                 );
  }
  bVar2 = ShouldSampleHashtablezInfo<std::allocator<char>>();
  if (bVar2) {
    SampleHashtablezInfo<true>(0x10,param_5,param_6,this->old_capacity_,this->was_soo_ & 1,c);
  }
  layout.slot_offset_._4_1_ =
       HashtablezInfoHandle::IsSampled((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7));
  sVar4 = CommonFields::capacity(c);
  RawHashSetLayout::RawHashSetLayout
            ((RawHashSetLayout *)&mem,sVar4,8,(bool)(layout.slot_offset_._4_1_ & 1));
  sVar4 = RawHashSetLayout::alloc_size((RawHashSetLayout *)&mem,0x10);
  pvStack_68 = Allocate<8ul,std::allocator<char>>(param_3,sVar4);
  local_69 = CommonFieldsGenerationInfoDisabled::generation((CommonFieldsGenerationInfoDisabled *)c)
  ;
  pvVar1 = pvStack_68;
  sVar4 = RawHashSetLayout::generation_offset((RawHashSetLayout *)&mem);
  CommonFieldsGenerationInfoDisabled::set_generation_ptr
            ((CommonFieldsGenerationInfoDisabled *)c,(GenerationType *)((long)pvVar1 + sVar4));
  GVar3 = NextGeneration(local_69);
  CommonFieldsGenerationInfoDisabled::set_generation((CommonFieldsGenerationInfoDisabled *)c,GVar3);
  pvVar1 = pvStack_68;
  sVar4 = RawHashSetLayout::control_offset((RawHashSetLayout *)&mem);
  CommonFields::set_control(c,(ctrl_t *)((long)pvVar1 + sVar4));
  pvVar1 = pvStack_68;
  sVar4 = RawHashSetLayout::slot_offset((RawHashSetLayout *)&mem);
  CommonFields::set_slots(c,(void *)((long)pvVar1 + sVar4));
  ResetGrowthLeft(c);
  sVar4 = this->old_capacity_;
  sVar5 = RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
  local_6a = IsGrowingIntoSingleGroupApplicable(sVar4,sVar5);
  if (((this->was_soo_ & 1U) == 0) || (!(bool)local_6a)) {
    if ((bool)local_6a) {
      absl::lts_20240722::container_internal::HashSetResizeHelper::
      GrowSizeIntoSingleGroupTransferable((CommonFields *)this,(ulong)c);
      std::allocator<char>::allocator(&local_6b);
      DeallocateOld<8ul,std::allocator<char>>(this,&local_6b,0x10);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b);
    }
    else {
      ResetCtrl(c,0x10);
    }
  }
  else {
    pcVar6 = CommonFields::control(c);
    RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
    absl::lts_20240722::container_internal::HashSetResizeHelper::InitControlBytesAfterSoo
              ((ctrl_t *)this,(ctrl_t)pcVar6,(ulong)(uint)(int)param_4);
    if ((this->had_soo_slot_ & 1U) != 0) {
      absl::lts_20240722::container_internal::HashSetResizeHelper::TransferSlotAfterSoo
                ((CommonFields *)this,(ulong)c);
    }
  }
  CommonFields::set_has_infoz(c,(bool)(layout.slot_offset_._4_1_ & 1));
  if ((layout.slot_offset_._4_1_ & 1) != 0) {
    sVar4 = CommonFields::size(c);
    sVar5 = RawHashSetLayout::capacity((RawHashSetLayout *)&mem);
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7),sVar4,sVar5);
    if ((((this->was_soo_ & 1U) != 0) || ((local_6a & 1) != 0)) || (this->old_capacity_ == 0)) {
      HashtablezInfoHandle::RecordRehash((HashtablezInfoHandle *)((long)&layout.slot_offset_ + 7),0)
      ;
    }
    CommonFields::set_infoz(c);
  }
  return (bool)(local_6a & 1);
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool InitializeSlots(CommonFields& c, Alloc alloc,
                                               ctrl_t soo_slot_h2,
                                               size_t key_size,
                                               size_t value_size) {
    assert(c.capacity());
    HashtablezInfoHandle infoz =
        ShouldSampleHashtablezInfo<Alloc>()
            ? SampleHashtablezInfo<SooEnabled>(SizeOfSlot, key_size, value_size,
                                               old_capacity_, was_soo_,
                                               forced_infoz_, c)
            : HashtablezInfoHandle{};

    const bool has_infoz = infoz.IsSampled();
    RawHashSetLayout layout(c.capacity(), AlignOfSlot, has_infoz);
    char* mem = static_cast<char*>(Allocate<BackingArrayAlignment(AlignOfSlot)>(
        &alloc, layout.alloc_size(SizeOfSlot)));
    const GenerationType old_generation = c.generation();
    c.set_generation_ptr(
        reinterpret_cast<GenerationType*>(mem + layout.generation_offset()));
    c.set_generation(NextGeneration(old_generation));
    c.set_control(reinterpret_cast<ctrl_t*>(mem + layout.control_offset()));
    c.set_slots(mem + layout.slot_offset());
    ResetGrowthLeft(c);

    const bool grow_single_group =
        IsGrowingIntoSingleGroupApplicable(old_capacity_, layout.capacity());
    if (SooEnabled && was_soo_ && grow_single_group) {
      InitControlBytesAfterSoo(c.control(), soo_slot_h2, layout.capacity());
      if (TransferUsesMemcpy && had_soo_slot_) {
        TransferSlotAfterSoo(c, SizeOfSlot);
      }
      // SooEnabled implies that old_capacity_ != 0.
    } else if ((SooEnabled || old_capacity_ != 0) && grow_single_group) {
      if (TransferUsesMemcpy) {
        GrowSizeIntoSingleGroupTransferable(c, SizeOfSlot);
        DeallocateOld<AlignOfSlot>(alloc, SizeOfSlot);
      } else {
        GrowIntoSingleGroupShuffleControlBytes(c.control(), layout.capacity());
      }
    } else {
      ResetCtrl(c, SizeOfSlot);
    }

    c.set_has_infoz(has_infoz);
    if (has_infoz) {
      infoz.RecordStorageChanged(c.size(), layout.capacity());
      if ((SooEnabled && was_soo_) || grow_single_group || old_capacity_ == 0) {
        infoz.RecordRehash(0);
      }
      c.set_infoz(infoz);
    }
    return grow_single_group;
  }